

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

int fmt::v10::detail::
    get_dynamic_spec<fmt::v10::detail::precision_checker,fmt::v10::basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,char>>,fmt::v10::detail::error_handler>
              (void)

{
  int iStack0000000000000008;
  long arg;
  undefined4 in_stack_00000018;
  
  switch(in_stack_00000018) {
  case 1:
    _iStack0000000000000008 = (ulong)iStack0000000000000008;
    break;
  case 2:
    _iStack0000000000000008 = _iStack0000000000000008 & 0xffffffff;
    goto LAB_001d4ac4;
  case 3:
    break;
  case 4:
  case 6:
    goto switchD_001d4a9b_caseD_4;
  case 5:
    if (arg < 0) goto LAB_001d4ab6;
    goto switchD_001d4a9b_caseD_4;
  default:
    throw_format_error("precision is not integer");
  }
  if ((long)_iStack0000000000000008 < 0) {
LAB_001d4ab6:
    throw_format_error("negative precision");
  }
LAB_001d4ac4:
  if (_iStack0000000000000008 >> 0x1f == 0) {
    return (int)_iStack0000000000000008;
  }
  throw_format_error("number is too big");
switchD_001d4a9b_caseD_4:
  goto LAB_001d4ac4;
}

Assistant:

FMT_CONSTEXPR auto get_dynamic_spec(FormatArg arg, ErrorHandler eh) -> int {
  unsigned long long value = visit_format_arg(Handler<ErrorHandler>(eh), arg);
  if (value > to_unsigned(max_value<int>())) eh.on_error("number is too big");
  return static_cast<int>(value);
}